

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O2

void __thiscall Lists<int_*>::append(Lists<int_*> *this,int *item)

{
  element_type *this_00;
  ListNodes<int_*> *this_01;
  shared_ptr<ListNodes<int_*>_> node;
  shared_ptr<ListNodes<int_*>_> local_38;
  __shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->theSize = this->theSize + 1;
  this_01 = (ListNodes<int_*> *)operator_new(0x18);
  local_38.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ListNodes<int_*>::ListNodes(this_01,item,&local_38);
  std::__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2>::reset<ListNodes<int*>>
            ((__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2> *)&node,this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  if ((this->theHead).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2> *)this,
               &node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    this_00 = (this->theLast).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,&node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2> *)this_00,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  std::__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->theLast).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>,
             &node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&node.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Lists<T>::append(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == nullptr) {
        theHead = node;
        theLast = node;
    } else {
        theLast->set_next(node);
        theLast = node;
    }
}